

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::in_range<'a',_'f'>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  const_iterator f;
  location *loc_00;
  bool bVar1;
  reference pcVar2;
  type l;
  region local_e0;
  success<toml::detail::region> local_98;
  failure_type local_49;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  char local_39;
  type tStack_38;
  char c;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  location *local_18;
  location *loc_local;
  
  local_18 = loc;
  loc_local = (location *)__return_storage_ptr__;
  local_20._M_current = (char *)location::iter(loc);
  local_28._M_current = (char *)location::end(local_18);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  if (bVar1) {
    none();
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(failure_type *)((long)&first._M_current + 7));
  }
  else {
    tStack_38 = location::iter(local_18);
    local_48._M_current = (char *)location::iter(local_18);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_48);
    local_39 = *pcVar2;
    if ((local_39 < 'a') || ('f' < local_39)) {
      none();
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_49);
    }
    else {
      location::advance(local_18,1);
      loc_00 = local_18;
      f._M_current = tStack_38._M_current;
      l = location::iter(local_18);
      region::region(&local_e0,loc_00,f,(const_iterator)l._M_current);
      ok<toml::detail::region>(&local_98,&local_e0);
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_98);
      success<toml::detail::region>::~success(&local_98);
      region::~region(&local_e0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c < lower || upper < c)
        {
            return none();
        }

        loc.advance();
        return ok(region(loc, first, loc.iter()));
    }